

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O3

void __thiscall
unodb::test::
tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
assert_growing_inodes
          (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,inode_type_counter_array *expected_growing_inode_counts)

{
  void *ptr;
  char *message;
  inode_type_counter_array actual_growing_inode_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  AssertHelper local_30;
  undefined1 local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  pointer local_18;
  
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_60,
             expected_growing_inode_counts->_M_elems,expected_growing_inode_counts[1]._M_elems,
             (allocator_type *)local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,&local_60);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  ptr = (void *)CONCAT71(local_28._1_7_,local_28[0]);
  if (ptr != (void *)0x0) {
    operator_delete(ptr,(long)local_18 - (long)ptr);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>::
  operator()(local_28,(char *)&local_48,(array<unsigned_long,_4UL> *)"(actual_growing_inode_counts)"
            );
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2c8,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

constexpr void assert_growing_inodes(
      const inode_type_counter_array &expected_growing_inode_counts)
      const noexcept {
    const auto actual_growing_inode_counts = test_db.get_growing_inode_counts();
    UNODB_ASSERT_THAT(
        actual_growing_inode_counts,
        ::testing::ElementsAreArray(expected_growing_inode_counts));
  }